

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

void nni_http_set_status(nng_http *conn,nng_http_status status,char *reason)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  anon_struct_16_2_3ef68a38 *paVar4;
  long lVar5;
  
  conn->code = status;
  if (reason != (char *)0x0) {
    if (status == NNG_HTTP_STATUS_OK) {
      paVar4 = nni_http_reason::http_status;
    }
    else {
      pcVar3 = "Unknown HTTP Status";
      lVar1 = 0;
      do {
        lVar5 = lVar1;
        if (lVar5 + 0x10 == 0x3a0) goto LAB_00121b39;
        lVar1 = lVar5 + 0x10;
      } while (*(nng_http_status *)((long)&nni_http_reason::http_status[1].code + lVar5) != status);
      paVar4 = (anon_struct_16_2_3ef68a38 *)(lVar5 + 0x15ab90);
    }
    pcVar3 = paVar4->mesg;
LAB_00121b39:
    iVar2 = strcmp(reason,pcVar3);
    if (iVar2 != 0) {
      pcVar3 = nni_strdup(reason);
      goto LAB_00121b58;
    }
  }
  pcVar3 = (char *)0x0;
LAB_00121b58:
  nni_strfree(conn->rsn);
  conn->rsn = pcVar3;
  return;
}

Assistant:

void
nni_http_set_status(nng_http *conn, nng_http_status status, const char *reason)
{
	conn->code = status;
	char *dup  = NULL;
	if (reason != NULL) {
		if (strcmp(reason, nni_http_reason(conn->code)) == 0) {
			dup = NULL;
		} else {
			// This might fail, but if it does, we will just
			// use the built in reason, which should not
			// fundamentally affect semantics.  This allows us to
			// make this function void, and avoid some error
			// handling.
			dup = nni_strdup(reason);
		}
	}
	nni_strfree(conn->rsn);
	conn->rsn = dup;
}